

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool __thiscall
ON_RTree::Search(ON_RTree *this,double *a_plane_eqn,double a_min,double a_max,
                _func_bool_void_ptr_ON__INT_PTR *a_resultCallback,void *a_context)

{
  bool bVar1;
  ON_RTreeSearchResultCallback result;
  double bounded_plane [6];
  ON_RTreeSearchResultCallback local_48;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  double local_18;
  double local_10;
  
  if (((a_min <= a_max) && (a_plane_eqn != (double *)0x0)) && (this->m_root != (ON_RTreeNode *)0x0))
  {
    local_38 = *a_plane_eqn;
    dStack_30 = a_plane_eqn[1];
    if ((((local_38 != 0.0) || (NAN(local_38))) ||
        ((dStack_30 != 0.0 || ((NAN(dStack_30) || (a_plane_eqn[2] != 0.0)))))) ||
       (NAN(a_plane_eqn[2]))) {
      local_28 = a_plane_eqn[2];
      dStack_20 = a_plane_eqn[3];
      local_48.m_context = a_context;
      local_48.m_resultCallback = a_resultCallback;
      local_18 = a_min;
      local_10 = a_max;
      bVar1 = SearchBoundedPlaneXYZHelper(this->m_root,&local_38,&local_48);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ON_RTree::Search(
  const double a_plane_eqn[4],
  double a_min,
  double a_max,
  bool ON_CALLBACK_CDECL a_resultCallback(void* a_context, ON__INT_PTR a_id),
  void* a_context
  ) const
{
  if (    0 == m_root 
       || 0 == a_plane_eqn 
       || !(a_min <= a_max) 
       || (0.0 == a_plane_eqn[0] && 0.0 == a_plane_eqn[1] && 0.0 == a_plane_eqn[2])
     )
    return false;

  double bounded_plane[6];
  bounded_plane[0] = a_plane_eqn[0];
  bounded_plane[1] = a_plane_eqn[1];
  bounded_plane[2] = a_plane_eqn[2];
  bounded_plane[3] = a_plane_eqn[3];
  bounded_plane[4] = a_min;
  bounded_plane[5] = a_max;

  ON_RTreeSearchResultCallback result;
  result.m_context = a_context;
  result.m_resultCallback = a_resultCallback;

  return SearchBoundedPlaneXYZHelper(m_root, bounded_plane, result);
}